

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkmsdevice.cpp
# Opt level: O1

drmModePropertyBlobPtr __thiscall
QKmsDevice::connectorPropertyBlob(QKmsDevice *this,drmModeConnectorPtr connector,QByteArray *name)

{
  int iVar1;
  long lVar2;
  drmModePropertyBlobPtr p_Var3;
  long lVar4;
  char *__s2;
  
  if (connector->count_props < 1) {
    p_Var3 = (drmModePropertyBlobPtr)0x0;
  }
  else {
    lVar4 = 1;
    p_Var3 = (drmModePropertyBlobPtr)0x0;
    do {
      lVar2 = drmModeGetProperty(this->m_dri_fd,connector->props[lVar4 + -1]);
      if (lVar2 != 0) {
        if ((*(byte *)(lVar2 + 4) & 0x10) != 0) {
          __s2 = (name->d).ptr;
          if (__s2 == (char *)0x0) {
            __s2 = (char *)&QByteArray::_empty;
          }
          iVar1 = strcmp((char *)(lVar2 + 8),__s2);
          if (iVar1 == 0) {
            p_Var3 = (drmModePropertyBlobPtr)
                     drmModeGetPropertyBlob(this->m_dri_fd,(int)connector->prop_values[lVar4 + -1]);
          }
        }
        drmModeFreeProperty(lVar2);
      }
    } while ((lVar4 < connector->count_props) &&
            (lVar4 = lVar4 + 1, p_Var3 == (drmModePropertyBlobPtr)0x0));
  }
  return p_Var3;
}

Assistant:

drmModePropertyBlobPtr QKmsDevice::connectorPropertyBlob(drmModeConnectorPtr connector, const QByteArray &name)
{
    drmModePropertyPtr prop;
    drmModePropertyBlobPtr blob = nullptr;

    for (int i = 0; i < connector->count_props && !blob; i++) {
        prop = drmModeGetProperty(m_dri_fd, connector->props[i]);
        if (!prop)
            continue;
        if ((prop->flags & DRM_MODE_PROP_BLOB) && (strcmp(prop->name, name.constData()) == 0))
            blob = drmModeGetPropertyBlob(m_dri_fd, connector->prop_values[i]);
        drmModeFreeProperty(prop);
    }

    return blob;
}